

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_auth_act(connectdata *conn)

{
  Curl_HttpReq CVar1;
  Curl_easy *data;
  _Bool _Var2;
  _Bool _Var3;
  CURLcode CVar4;
  int iVar5;
  char *pcVar6;
  
  data = conn->data;
  iVar5 = (data->req).httpcode;
  if (iVar5 - 100U < 100) {
    return CURLE_OK;
  }
  if ((data->state).authproblem == true) {
    if ((data->set).http_fail_on_error == false) {
      return CURLE_OK;
    }
    return CURLE_HTTP_RETURNED_ERROR;
  }
  if ((conn->oauth_bearer != (char *)0x0 | (conn->bits).user_passwd) == 1) {
    if (iVar5 != 0x191) {
      _Var2 = false;
      if ((299 < iVar5) || (_Var2 = false, (conn->bits).authneg == false)) goto LAB_00111494;
    }
    _Var2 = pickoneauth(&(data->state).authhost,
                        -(ulong)(conn->oauth_bearer != (char *)0x0) | 0xffffffffffffffbf);
    if (!_Var2) {
      (data->state).authproblem = true;
    }
    if (((data->state).authhost.picked == 8) && (0xb < conn->httpversion)) {
      Curl_infof(data,"Forcing HTTP/1.1 for NTLM");
      Curl_conncontrol(conn,1);
      (conn->data->set).httpversion = 2;
    }
  }
  else {
    _Var2 = false;
  }
LAB_00111494:
  if (((conn->bits).proxy_user_passwd == true) &&
     ((iVar5 = (data->req).httpcode, iVar5 == 0x197 ||
      ((iVar5 < 300 && ((conn->bits).authneg != false)))))) {
    _Var3 = pickoneauth(&(data->state).authproxy,0xffffffffffffffbf);
    if (!_Var3) {
      (data->state).authproblem = true;
      goto LAB_001114d6;
    }
  }
  else {
LAB_001114d6:
    if (_Var2 == false) {
      if (((((data->req).httpcode < 300) && ((data->state).authhost.done == false)) &&
          ((conn->bits).authneg == true)) &&
         ((CVar1 = (data->set).httpreq, CVar1 != HTTPREQ_GET && (CVar1 != HTTPREQ_HEAD)))) {
        pcVar6 = (*Curl_cstrdup)((data->change).url);
        (data->req).newurl = pcVar6;
        if (pcVar6 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (data->state).authhost.done = true;
      }
      goto LAB_0011158f;
    }
  }
  CVar1 = (data->set).httpreq;
  if (((CVar1 != HTTPREQ_GET) && (CVar1 != HTTPREQ_HEAD)) &&
     (((conn->bits).rewindaftersend == false &&
      (CVar4 = http_perhapsrewind(conn), CVar4 != CURLE_OK)))) {
    return CVar4;
  }
  (*Curl_cfree)((data->req).newurl);
  (data->req).newurl = (char *)0x0;
  pcVar6 = (*Curl_cstrdup)((data->change).url);
  (data->req).newurl = pcVar6;
  if (pcVar6 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
LAB_0011158f:
  iVar5 = http_should_fail(conn);
  if (iVar5 == 0) {
    CVar4 = CURLE_OK;
  }
  else {
    Curl_failf(data,"The requested URL returned error: %d",(ulong)(uint)(data->req).httpcode);
    CVar4 = CURLE_HTTP_RETURNED_ERROR;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_http_auth_act(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  bool pickhost = FALSE;
  bool pickproxy = FALSE;
  CURLcode result = CURLE_OK;
  unsigned long authmask = ~0ul;

  if(!conn->oauth_bearer)
    authmask &= (unsigned long)~CURLAUTH_BEARER;

  if(100 <= data->req.httpcode && 199 >= data->req.httpcode)
    /* this is a transient response code, ignore */
    return CURLE_OK;

  if(data->state.authproblem)
    return data->set.http_fail_on_error?CURLE_HTTP_RETURNED_ERROR:CURLE_OK;

  if((conn->bits.user_passwd || conn->oauth_bearer) &&
     ((data->req.httpcode == 401) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickhost = pickoneauth(&data->state.authhost, authmask);
    if(!pickhost)
      data->state.authproblem = TRUE;
    if(data->state.authhost.picked == CURLAUTH_NTLM &&
       conn->httpversion > 11) {
      infof(data, "Forcing HTTP/1.1 for NTLM");
      connclose(conn, "Force HTTP/1.1 connection");
      conn->data->set.httpversion = CURL_HTTP_VERSION_1_1;
    }
  }
  if(conn->bits.proxy_user_passwd &&
     ((data->req.httpcode == 407) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickproxy = pickoneauth(&data->state.authproxy,
                            authmask & ~CURLAUTH_BEARER);
    if(!pickproxy)
      data->state.authproblem = TRUE;
  }

  if(pickhost || pickproxy) {
    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD) &&
       !conn->bits.rewindaftersend) {
      result = http_perhapsrewind(conn);
      if(result)
        return result;
    }
    /* In case this is GSS auth, the newurl field is already allocated so
       we must make sure to free it before allocating a new one. As figured
       out in bug #2284386 */
    Curl_safefree(data->req.newurl);
    data->req.newurl = strdup(data->change.url); /* clone URL */
    if(!data->req.newurl)
      return CURLE_OUT_OF_MEMORY;
  }
  else if((data->req.httpcode < 300) &&
          (!data->state.authhost.done) &&
          conn->bits.authneg) {
    /* no (known) authentication available,
       authentication is not "done" yet and
       no authentication seems to be required and
       we didn't try HEAD or GET */
    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD)) {
      data->req.newurl = strdup(data->change.url); /* clone URL */
      if(!data->req.newurl)
        return CURLE_OUT_OF_MEMORY;
      data->state.authhost.done = TRUE;
    }
  }
  if(http_should_fail(conn)) {
    failf(data, "The requested URL returned error: %d",
          data->req.httpcode);
    result = CURLE_HTTP_RETURNED_ERROR;
  }

  return result;
}